

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

iterator __thiscall QString::erase(QString *this,const_iterator first,const_iterator last)

{
  QChar *__last;
  iterator pQVar1;
  QChar *in_RDX;
  QString *in_RDI;
  difference_type len;
  difference_type start;
  QChar *in_stack_ffffffffffffffe0;
  
  cbegin((QString *)0x51dc16);
  __last = (QChar *)std::distance<QChar_const*>(in_RDX,in_stack_ffffffffffffffe0);
  std::distance<QChar_const*>(in_RDX,__last);
  remove(in_RDI,(char *)__last);
  pQVar1 = begin(in_RDI);
  return pQVar1 + (long)__last;
}

Assistant:

QString::iterator QString::erase(QString::const_iterator first, QString::const_iterator last)
{
    const auto start = std::distance(cbegin(), first);
    const auto len = std::distance(first, last);
    remove(start, len);
    return begin() + start;
}